

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_vb.c
# Opt level: O1

UINT8 device_start_saa1099_vb(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  UINT8 UVar2;
  DEV_DATA DVar3;
  undefined4 *puVar4;
  long lVar5;
  SAA_CHIP *saa;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = cfg->clock;
  if ((cfg->srMode == '\x01') ||
     ((uVar6 = uVar1 >> 7, cfg->srMode == '\x02' && (uVar6 < cfg->smplRate)))) {
    uVar6 = cfg->smplRate;
  }
  DVar3.chipInf = calloc(1,0x110);
  if (DVar3.chipInf == (void *)0x0) {
    DVar3.chipInf = (void *)0x0;
  }
  else {
    *(uint *)((long)DVar3.chipInf + 0x10c) = uVar1;
    *(uint *)((long)DVar3.chipInf + 0x108) = uVar6;
    uVar7 = 0;
    *(ulong *)((long)DVar3.chipInf + 0xf8) = CONCAT44(uVar1,(uVar6 << 7) >> 1) / (ulong)(uVar6 << 7)
    ;
    puVar4 = (undefined4 *)((long)DVar3.chipInf + 0xb4);
    do {
      *puVar4 = (int)((uVar7 & 0xffffffff) / 6);
      uVar7 = uVar7 + 0x800;
      puVar4 = puVar4 + 1;
    } while (uVar7 != 0x8000);
    lVar5 = 0x15;
    do {
      *(undefined1 *)((long)DVar3.chipInf + lVar5) = 0;
      lVar5 = lVar5 + 0xe;
    } while (lVar5 != 0x69);
  }
  if (DVar3.chipInf == (void *)0x0) {
    UVar2 = 0xff;
  }
  else {
    *(void **)DVar3.chipInf = DVar3.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
    retDevInf->sampleRate = uVar6;
    retDevInf->devDef = &devDef_SAA1099_VB;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_saa1099_vb(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 128;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = saa1099v_create(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_SAA1099_VB);
	return 0x00;
}